

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O0

void __thiscall
OpenMD::EAM::addExplicitInteraction
          (EAM *this,AtomType *atype1,AtomType *atype2,RealType re,RealType alpha,RealType A,
          RealType Ci,RealType Cj)

{
  int iVar1;
  int iVar2;
  EAM *this_00;
  double *re_00;
  _Rb_tree_const_iterator<int> __x;
  reference pvVar3;
  reference pvVar4;
  AtomType *in_RDX;
  AtomType *in_RSI;
  RealType in_RDI;
  double in_XMM0_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar5;
  pair<std::_Rb_tree_const_iterator<int>,_bool> ret;
  int eamtid2;
  int eamtid1;
  int atid2;
  int atid1;
  RealType kappa;
  int i;
  RealType dr;
  RealType rcut;
  RealType phiCC;
  RealType r;
  int Nr;
  vector<double,_std::allocator<double>_> phiVals;
  vector<double,_std::allocator<double>_> rVals;
  EAMInteractionData mixer;
  CubicSplinePtr cs;
  EAMInteractionData *in_stack_fffffffffffffe08;
  value_type in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  undefined4 uVar6;
  value_type_conflict1 *in_stack_fffffffffffffe18;
  value_type in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  undefined4 uVar7;
  value_type_conflict2 *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe38;
  CubicSpline *in_stack_fffffffffffffe40;
  RealType in_stack_fffffffffffffe48;
  RealType in_stack_fffffffffffffe50;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_180;
  _Base_ptr local_170;
  undefined1 local_168;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_160;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_150;
  value_type local_140;
  value_type local_13c;
  int local_138;
  int local_134;
  pair<double,_double> local_130;
  undefined8 local_120;
  int local_114;
  double local_110;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  RealType local_d8;
  double local_d0;
  int local_c4;
  undefined8 local_70;
  undefined8 local_68;
  double local_60;
  undefined1 local_58;
  undefined8 local_40;
  undefined8 local_38;
  double local_20;
  AtomType *local_18;
  AtomType *local_10;
  
  local_40 = in_XMM4_Qa;
  local_38 = in_XMM3_Qa;
  local_20 = in_XMM0_Qa;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::make_shared<OpenMD::CubicSpline>();
  EAMInteractionData::EAMInteractionData
            ((EAMInteractionData *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x3bd5a0);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x3bd5ad);
  local_c4 = 2000;
  local_e8 = 12.0;
  local_f0 = 9.0;
  local_f8 = local_20 * 4.0;
  this_00 = (EAM *)std::max<double>(&local_f0,&local_f8);
  re_00 = std::min<double>(&local_e8,(double *)this_00);
  local_e0 = *re_00;
  local_110 = local_e0 / (double)(local_c4 + -1);
  for (local_114 = 0; local_114 < local_c4; local_114 = local_114 + 1) {
    local_d0 = (double)local_114 * local_110;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe18);
    local_120 = 0;
    in_stack_fffffffffffffe50 =
         PhiCoreCore(this_00,in_RDI,(RealType)re_00,in_stack_fffffffffffffe50,
                     in_stack_fffffffffffffe48,(RealType)in_stack_fffffffffffffe40);
    local_d8 = in_stack_fffffffffffffe50;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe18);
  }
  std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x3bd79d);
  CubicSpline::addPoints
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
             (vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  std::shared_ptr<OpenMD::CubicSpline>::operator=
            ((shared_ptr<OpenMD::CubicSpline> *)
             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
             &in_stack_fffffffffffffe08->phi);
  std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x3bd7db);
  local_130 = CubicSpline::getLimits
                        ((CubicSpline *)
                         CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  local_60 = local_130.second;
  local_70 = local_38;
  local_68 = local_40;
  local_58 = 1;
  iVar1 = AtomType::getIdent(local_10);
  local_134 = iVar1;
  iVar2 = AtomType::getIdent(local_18);
  local_138 = iVar2;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::
  pair<std::_Rb_tree_const_iterator<int>,_bool,_true>
            ((pair<std::_Rb_tree_const_iterator<int>,_bool> *)
             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)CONCAT44(iVar1,iVar2),
                     in_stack_fffffffffffffe28);
  __x = pVar5.first._M_node;
  local_168 = pVar5.second;
  uVar7 = CONCAT13(local_168,(int3)in_stack_fffffffffffffe24);
  local_170 = __x._M_node;
  local_160.first._M_node = __x._M_node;
  local_160.second = (bool)local_168;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::operator=(&local_150,&local_160);
  if ((local_150.second & 1U) == 0) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)((long)in_RDI + 0x40),(long)local_134);
    local_13c = *pvVar3;
  }
  else {
    local_13c = *(value_type *)((long)in_RDI + 0x88);
    in_stack_fffffffffffffe20 = *(value_type *)((long)in_RDI + 0x88);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)((long)in_RDI + 0x40),(long)local_134);
    *pvVar3 = in_stack_fffffffffffffe20;
    *(int *)((long)in_RDI + 0x88) = *(int *)((long)in_RDI + 0x88) + 1;
  }
  pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)CONCAT44(iVar1,iVar2),
                     (value_type_conflict2 *)__x._M_node);
  local_180.first = pVar5.first._M_node;
  local_180.second = pVar5.second;
  uVar6 = CONCAT13(local_180.second,(int3)in_stack_fffffffffffffe14);
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::operator=(&local_150,&local_180);
  if ((local_150.second & 1U) == 0) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)((long)in_RDI + 0x40),(long)local_138);
    local_140 = *pvVar3;
  }
  else {
    local_140 = *(value_type *)((long)in_RDI + 0x88);
    in_stack_fffffffffffffe10 = *(value_type *)((long)in_RDI + 0x88);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)((long)in_RDI + 0x40),(long)local_138);
    *pvVar3 = in_stack_fffffffffffffe10;
    *(int *)((long)in_RDI + 0x88) = *(int *)((long)in_RDI + 0x88) + 1;
  }
  std::
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  ::resize((vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
            *)CONCAT44(iVar1,iVar2),(size_type)__x._M_node);
  std::
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  ::operator[]((vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                *)((long)in_RDI + 0x70),(long)local_13c);
  std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::resize
            ((vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_> *)
             CONCAT44(iVar1,iVar2),(size_type)__x._M_node);
  pvVar4 = std::
           vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
           ::operator[]((vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                         *)((long)in_RDI + 0x70),(long)local_13c);
  std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::operator[]
            (pvVar4,(long)local_140);
  EAMInteractionData::operator=
            ((EAMInteractionData *)CONCAT44(uVar6,in_stack_fffffffffffffe10),
             in_stack_fffffffffffffe08);
  if (local_140 != local_13c) {
    std::
    vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
    ::operator[]((vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                  *)((long)in_RDI + 0x70),(long)local_140);
    std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::resize
              ((vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_> *)
               CONCAT44(iVar1,iVar2),(size_type)__x._M_node);
    pvVar4 = std::
             vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
             ::operator[]((vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                           *)((long)in_RDI + 0x70),(long)local_140);
    std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::operator[]
              (pvVar4,(long)local_13c);
    EAMInteractionData::operator=
              ((EAMInteractionData *)CONCAT44(uVar6,in_stack_fffffffffffffe10),
               in_stack_fffffffffffffe08);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(uVar7,in_stack_fffffffffffffe20));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(uVar7,in_stack_fffffffffffffe20));
  EAMInteractionData::~EAMInteractionData
            ((EAMInteractionData *)CONCAT44(uVar6,in_stack_fffffffffffffe10));
  std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x3bdb78);
  return;
}

Assistant:

void EAM::addExplicitInteraction(AtomType* atype1, AtomType* atype2,
                                   RealType re, RealType alpha, RealType A,
                                   RealType Ci, RealType Cj) {
    CubicSplinePtr cs {std::make_shared<CubicSpline>()};

    EAMInteractionData mixer;
    std::vector<RealType> rVals;
    std::vector<RealType> phiVals;

    int Nr = 2000;
    RealType r;
    RealType phiCC;

    RealType rcut = std::min(12.0, std::max(9.0, 4.0 * re));
    RealType dr   = rcut / (RealType)(Nr - 1);

    for (int i = 0; i < Nr; i++) {
      r = RealType(i) * dr;
      rVals.push_back(r);
      // for Dream2 and EAMOxide explicit potential we dont care about kappa
      // but it is needed while calling PhiCoreCore. So, lets define it as 0
      // its value however is not used in calculation
      RealType kappa = 0;
      phiCC          = PhiCoreCore(r, re, A, alpha, kappa);
      phiVals.push_back(phiCC);
    }

    cs->addPoints(rVals, phiVals);
    // this is the repulsive piece in explicit EAM Oxide potential
    // this is phiCC for the explicit EAM oxide potential for convinence, it
    // is represented as phi
    mixer.phi  = cs;
    mixer.rcut = mixer.phi->getLimits().second;

    mixer.Ci = Ci;
    mixer.Cj = Cj;

    mixer.explicitlySet = true;

    int atid1 = atype1->getIdent();
    int atid2 = atype2->getIdent();

    int eamtid1, eamtid2;

    pair<set<int>::iterator, bool> ret;
    ret = EAMtypes.insert(atid1);
    if (ret.second == false) {
      // already had this type in the EAMMap, just get the eamtid:
      eamtid1 = EAMtids[atid1];
    } else {
      // didn't already have it, so make a new one and assign it:
      eamtid1        = nEAM_;
      EAMtids[atid1] = nEAM_;
      nEAM_++;
    }

    ret = EAMtypes.insert(atid2);
    if (ret.second == false) {
      // already had this type in the EAMMap, just get the eamtid:
      eamtid2 = EAMtids[atid2];
    } else {
      // didn't already have it, so make a new one and assign it:
      eamtid2        = nEAM_;
      EAMtids[atid2] = nEAM_;
      nEAM_++;
    }

    MixingMap.resize(nEAM_);
    MixingMap[eamtid1].resize(nEAM_);
    MixingMap[eamtid1][eamtid2] = mixer;
    if (eamtid2 != eamtid1) {
      MixingMap[eamtid2].resize(nEAM_);
      MixingMap[eamtid2][eamtid1] = mixer;
    }
    return;
  }